

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O0

type * viennamath::result_of::
       subtract<viennamath::ct_constant<8L>,_viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_true,_false>
       ::instance(type *__return_storage_ptr__,ct_constant<8L> *lhs,
                 rt_constant<double,_viennamath::rt_expression_interface<double>_> *rhs)

{
  rt_expression_interface<double> *lhs_00;
  op_interface_type *op;
  rt_expression_interface<double> *rhs_00;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *rhs_local;
  ct_constant<8L> *lhs_local;
  
  lhs_00 = traits::clone<viennamath::rt_expression_interface<double>,8l>(lhs);
  op = (op_interface_type *)operator_new(8);
  memset(op,0,8);
  op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_minus<double>,_viennamath::rt_expression_interface<double>_>
              *)op);
  rhs_00 = traits::clone<viennamath::rt_expression_interface<double>,double>(rhs);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (__return_storage_ptr__,lhs_00,op,rhs_00);
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_minus<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }